

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int build_esni_contents_hash
              (ptls_hash_algorithm_t *hash,uint8_t *digest,uint8_t *record_digest,uint16_t group,
              ptls_iovec_t pubkey,uint8_t *client_random)

{
  size_t sVar1;
  uint8_t *puVar2;
  size_t delta;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  ptls_iovec_t pubkey_00;
  size_t sVar10;
  int iVar11;
  ptls_hash_context_t *ppVar12;
  uint8_t *puVar13;
  ushort uVar14;
  size_t sVar15;
  uint8_t smallbuf [256];
  ptls_buffer_t local_180;
  uint8_t *local_160;
  ptls_hash_algorithm_t *local_158;
  uint8_t *local_150;
  uint8_t *local_148;
  size_t local_140;
  uint8_t local_138 [264];
  
  local_140 = pubkey.len;
  local_148 = pubkey.base;
  local_180.base = local_138;
  local_180.off = 0;
  local_180.capacity = 0x100;
  local_180.is_allocated = 0;
  iVar11 = ptls_buffer_reserve(&local_180,2);
  sVar10 = local_180.off;
  puVar13 = local_180.base;
  sVar15 = local_180.off;
  if (iVar11 == 0) {
    (local_180.base + local_180.off)[0] = '\0';
    (local_180.base + local_180.off)[1] = '\0';
    sVar1 = local_180.off + 2;
    delta = hash->digest_size;
    local_180.off = sVar1;
    local_160 = digest;
    local_158 = hash;
    local_150 = record_digest;
    if (delta != 0) {
      iVar11 = ptls_buffer_reserve(&local_180,delta);
      sVar15 = local_180.off;
      puVar13 = local_180.base;
      if (iVar11 != 0) goto LAB_0010e350;
      memcpy(local_180.base + local_180.off,local_150,delta);
      local_180.off = sVar15 + delta;
    }
    uVar14 = (short)local_180.off - (short)sVar1;
    *(ushort *)(puVar13 + sVar10) = uVar14 * 0x100 | uVar14 >> 8;
    pubkey_00.len = local_140;
    pubkey_00.base = local_148;
    iVar11 = push_key_share_entry(&local_180,group,pubkey_00);
    puVar13 = local_180.base;
    sVar15 = local_180.off;
    if ((iVar11 == 0) &&
       (iVar11 = ptls_buffer_reserve(&local_180,0x20), puVar13 = local_180.base,
       sVar15 = local_180.off, iVar11 == 0)) {
      uVar3 = *(undefined4 *)client_random;
      uVar4 = *(undefined4 *)(client_random + 4);
      uVar5 = *(undefined4 *)(client_random + 8);
      uVar6 = *(undefined4 *)(client_random + 0xc);
      uVar7 = *(undefined4 *)(client_random + 0x14);
      uVar8 = *(undefined4 *)(client_random + 0x18);
      uVar9 = *(undefined4 *)(client_random + 0x1c);
      puVar2 = local_180.base + local_180.off + 0x10;
      *(undefined4 *)puVar2 = *(undefined4 *)(client_random + 0x10);
      *(undefined4 *)(puVar2 + 4) = uVar7;
      *(undefined4 *)(puVar2 + 8) = uVar8;
      *(undefined4 *)(puVar2 + 0xc) = uVar9;
      puVar2 = local_180.base + local_180.off;
      *(undefined4 *)puVar2 = uVar3;
      *(undefined4 *)(puVar2 + 4) = uVar4;
      *(undefined4 *)(puVar2 + 8) = uVar5;
      *(undefined4 *)(puVar2 + 0xc) = uVar6;
      sVar15 = local_180.off + 0x20;
      ppVar12 = (*local_158->create)();
      if (ppVar12 == (ptls_hash_context_t *)0x0) {
        iVar11 = 0x201;
      }
      else {
        (*ppVar12->update)(ppVar12,puVar13,sVar15);
        iVar11 = 0;
        (*ppVar12->final)(ppVar12,local_160,PTLS_HASH_FINAL_MODE_FREE);
      }
    }
  }
LAB_0010e350:
  (*ptls_clear_memory)(puVar13,sVar15);
  if (local_180.is_allocated != 0) {
    free(puVar13);
  }
  return iVar11;
}

Assistant:

static int build_esni_contents_hash(ptls_hash_algorithm_t *hash, uint8_t *digest, const uint8_t *record_digest, uint16_t group,
                                    ptls_iovec_t pubkey, const uint8_t *client_random)
{
    ptls_buffer_t buf;
    uint8_t smallbuf[256];
    int ret;

    /* build ESNIContents */
    ptls_buffer_init(&buf, smallbuf, sizeof(smallbuf));
    ptls_buffer_push_block(&buf, 2, { ptls_buffer_pushv(&buf, record_digest, hash->digest_size); });
    if ((ret = push_key_share_entry(&buf, group, pubkey)) != 0)
        goto Exit;
    ptls_buffer_pushv(&buf, client_random, PTLS_HELLO_RANDOM_SIZE);

    /* calculate digest */
    if ((ret = ptls_calc_hash(hash, digest, buf.base, buf.off)) != 0)
        goto Exit;

    ret = 0;
Exit:
    ptls_buffer_dispose(&buf);
    return ret;
}